

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O2

streamsize __thiscall
stream::inno_exe_decoder_4108::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_4108 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = n;
  }
  do {
    if (uVar4 == uVar3) {
      return n;
    }
    uVar1 = boost::iostreams::detail::read_device_impl<boost::iostreams::streambuf_tag>::
            get<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>(src);
    if (uVar1 == 0xfffffffe) {
      return uVar3;
    }
    if (uVar1 == 0xffffffff) {
      return uVar3 | -(ulong)(uVar3 == 0);
    }
    if (this->addr_bytes_left == 0) {
      if ((uVar1 & 0xfffffffe) == 0xe8) {
        this->addr = -this->addr_offset;
        sVar2 = 4;
        goto LAB_001443dc;
      }
    }
    else {
      uVar1 = (uVar1 & 0xff) + this->addr;
      this->addr = uVar1 >> 8;
      sVar2 = this->addr_bytes_left - 1;
LAB_001443dc:
      this->addr_bytes_left = sVar2;
    }
    dest[uVar3] = (char)uVar1;
    uVar3 = uVar3 + 1;
    this->addr_offset = this->addr_offset + 1;
  } while( true );
}

Assistant:

std::streamsize inno_exe_decoder_4108::read(Source & src, char * dest, std::streamsize n) {
	
	for(std::streamsize i = 0; i < n; i++, addr_offset++) {
		
		int byte = boost::iostreams::get(src);
		if(byte == EOF) { return i ? i : EOF; }
		if(byte == boost::iostreams::WOULD_BLOCK) { return i; }
		
		if(addr_bytes_left == 0) {
			
			// Check if this is a CALL or JMP instruction.
			if(byte == 0xe8 || byte == 0xe9) {
				addr = ~addr_offset + 1;
				addr_bytes_left = 4;
			}
			
		} else {
			addr += boost::uint8_t(byte);
			byte = boost::uint8_t(addr);
			addr >>= 8;
			addr_bytes_left--;
		}
		
		*dest++ = char(boost::uint8_t(byte));
	}
	
	return n;
}